

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ForLoopStatementSyntax::setChild
          (ForLoopStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0050997c + *(int *)(&DAT_0050997c + index * 4)))();
  return;
}

Assistant:

void ForLoopStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: forKeyword = child.token(); return;
        case 3: openParen = child.token(); return;
        case 4: initializers = child.node()->as<SeparatedSyntaxList<SyntaxNode>>(); return;
        case 5: semi1 = child.token(); return;
        case 6: stopExpr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 7: semi2 = child.token(); return;
        case 8: steps = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 9: closeParen = child.token(); return;
        case 10: statement = child.node() ? &child.node()->as<StatementSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}